

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_unittest.cc
# Opt level: O2

void __thiscall
Test_Template_RecursiveInclude::Test_Template_RecursiveInclude(Test_Template_RecursiveInclude *this)

{
  _func_void *local_8;
  
  local_8 = Run;
  std::vector<void(*)(),std::allocator<void(*)()>>::emplace_back<void(*)()>
            ((vector<void(*)(),std::allocator<void(*)()>> *)&g_testlist,&local_8);
  return;
}

Assistant:

TEST(Template, RecursiveInclude) {
  string incname = StringToTemplateFile("hi {{>INC}} bar\n  {{>INC}}!");
  Template* tpl = Template::GetTemplate(incname, DO_NOT_STRIP);
  TemplateDictionary dict("dict");
  dict.AddIncludeDictionary("INC")->SetFilename(incname);
  // Note the last line is indented 4 spaces instead of 2.  This is
  // because the last sub-include is indented.
  AssertExpandIs(tpl, &dict, "hi hi  bar\n  ! bar\n  hi  bar\n    !!", true);
}